

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O2

vector<char,_std::allocator<char>_> *
cnpy::create_npy_header<double>
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *shape)

{
  char cVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  value_type local_a9;
  vector<char,_std::allocator<char>_> dict;
  string local_90;
  string local_70;
  string local_50;
  
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cnpy::operator+=((vector *)&dict,"{\'descr\': \'");
  cVar1 = cnpy::BigEndianTest();
  operator+=(&dict,cVar1);
  cVar1 = cnpy::map_type((type_info *)&double::typeinfo);
  operator+=(&dict,cVar1);
  std::__cxx11::to_string(&local_70,8);
  cnpy::operator+=(&dict,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  cnpy::operator+=((vector *)&dict,"\', \'fortran_order\': False, \'shape\': (");
  std::__cxx11::to_string
            (&local_90,
             *(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start);
  cnpy::operator+=(&dict,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  for (uVar3 = 1;
      lVar2 = (long)(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start, uVar3 < (ulong)(lVar2 >> 3);
      uVar3 = uVar3 + 1) {
    cnpy::operator+=((vector *)&dict,", ");
    std::__cxx11::to_string
              (&local_50,
               (shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar3]);
    cnpy::operator+=((vector *)&dict,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (lVar2 == 8) {
    cnpy::operator+=((vector *)&dict,",");
  }
  cnpy::operator+=((vector *)&dict,"), }");
  local_a9 = ' ';
  std::vector<char,_std::allocator<char>_>::insert
            (&dict,(const_iterator)
                   dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,
             0x10 - (ulong)(((int)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (int)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start) + 10U & 0xf),&local_a9);
  dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish[-1]
       = '\n';
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator+=(__return_storage_ptr__,-0x6d);
  cnpy::operator+=((vector *)__return_storage_ptr__,"NUMPY");
  operator+=(__return_storage_ptr__,'\x01');
  operator+=(__return_storage_ptr__,'\0');
  operator+=(__return_storage_ptr__,
             (short)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (short)dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  std::vector<char,std::allocator<char>>::
  insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
             (const_iterator)
             (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                      dict.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&dict.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> create_npy_header(const std::vector<size_t>& shape) {  

        std::vector<char> dict;
        dict += "{'descr': '";
        dict += BigEndianTest();
        dict += map_type(typeid(T));
        dict += std::to_string(sizeof(T));
        dict += "', 'fortran_order': False, 'shape': (";
        dict += std::to_string(shape[0]);
        for(size_t i = 1;i < shape.size();i++) {
            dict += ", ";
            dict += std::to_string(shape[i]);
        }
        if(shape.size() == 1) dict += ",";
        dict += "), }";
        //pad with spaces so that preamble+dict is modulo 16 bytes. preamble is 10 bytes. dict needs to end with \n
        int remainder = 16 - (10 + dict.size()) % 16;
        dict.insert(dict.end(),remainder,' ');
        dict.back() = '\n';

        std::vector<char> header;
        header += (char) 0x93;
        header += "NUMPY";
        header += (char) 0x01; //major version of numpy format
        header += (char) 0x00; //minor version of numpy format
        header += (uint16_t) dict.size();
        header.insert(header.end(),dict.begin(),dict.end());

        return header;
    }